

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec)

{
  ulong uVar1;
  alignment aVar2;
  alignment aVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined3 uVar7;
  basic_buffer<char> *pbVar6;
  double_writer f;
  char *pcVar8;
  byte bVar9;
  char *pcVar10;
  double dVar11;
  inf_or_nan_writer f_00;
  float_spec_handler<char> handler;
  align_spec as;
  write_inf_or_nan_t write_inf_or_nan;
  float_spec_handler<char> local_2ba;
  format_specs local_2b8;
  double local_298;
  size_t local_288;
  byte bStack_280;
  undefined7 uStack_27f;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *local_278;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *local_270;
  undefined1 local_268 [13];
  undefined3 uStack_25b;
  undefined5 uStack_258;
  byte local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  local_2ba.type = spec->type_;
  local_2ba.upper = false;
  local_298 = value;
  internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>
            (local_2ba.type,&local_2ba);
  if ((long)local_298 < 0) {
    dVar11 = (double)((ulong)local_298 ^ (ulong)DAT_00167420);
    bVar9 = 0x2d;
  }
  else {
    dVar11 = local_298;
    if ((spec->flags_ & 1) == 0) {
      bVar9 = 0;
    }
    else {
      bVar9 = 0x2b;
      if ((spec->flags_ & 2) == 0) {
        bVar9 = 0x20;
      }
    }
  }
  local_268._0_4_ = (spec->super_align_spec).width_;
  local_268._4_4_ = (spec->super_align_spec).fill_;
  local_268._8_5_ = (undefined5)*(undefined8 *)&(spec->super_align_spec).align_;
  uVar5 = *(undefined8 *)((long)&spec->flags_ + 1);
  uStack_25b = (undefined3)uVar5;
  uStack_258 = (undefined5)((ulong)uVar5 >> 0x18);
  local_270 = this;
  local_250 = bVar9;
  if (NAN(dVar11)) {
    pcVar8 = "NAN";
    pcVar10 = "nan";
LAB_0011cebb:
    if (local_2ba.upper != false) {
      pcVar10 = pcVar8;
    }
    f_00._1_7_ = 0;
    f_00.sign = bVar9;
    f_00.str = pcVar10;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::inf_or_nan_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,4 - (ulong)(bVar9 == 0),(align_spec *)local_268,f_00);
    return;
  }
  if (INFINITY <= dVar11) {
    pcVar8 = "INF";
    pcVar10 = "inf";
    goto LAB_0011cebb;
  }
  local_248.super_basic_buffer<char>.size_ = 0;
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00194440;
  local_248.super_basic_buffer<char>.capacity_ = 500;
  uVar4 = spec->precision_;
  uVar7 = *(undefined3 *)&spec->field_0x15;
  local_2b8.super_align_spec.width_ = (spec->super_align_spec).width_;
  local_2b8.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  local_2b8._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  local_2b8.type_ = local_2ba.type;
  local_2b8.precision_ = uVar4;
  local_2b8._21_3_ = uVar7;
  local_248.super_basic_buffer<char>.ptr_ = local_248.store_;
  write_double_sprintf<double>(this,dVar11,&local_2b8,&local_248.super_basic_buffer<char>);
  local_288 = local_248.super_basic_buffer<char>.size_;
  aVar2 = (spec->super_align_spec).align_;
  local_2b8.super_align_spec.width_ = (spec->super_align_spec).width_;
  local_2b8.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  aVar3 = (spec->super_align_spec).align_;
  if (aVar3 == ALIGN_DEFAULT) {
    local_2b8.super_align_spec.align_ = ALIGN_RIGHT;
  }
  else {
    local_2b8.super_align_spec.align_ = aVar2;
    if (aVar3 == ALIGN_NUMERIC) {
      if (bVar9 != 0) {
        pbVar6 = (this->out_).container;
        dVar11 = (double)pbVar6->size_;
        uVar1 = (long)dVar11 + 1;
        if (pbVar6->capacity_ < uVar1) {
          local_298 = dVar11;
          (**pbVar6->_vptr_basic_buffer)(pbVar6,uVar1);
          dVar11 = local_298;
        }
        pbVar6->size_ = uVar1;
        pbVar6->ptr_[(long)dVar11] = bVar9;
        if (local_2b8.super_align_spec.width_ != 0) {
          local_2b8.super_align_spec.width_ = local_2b8.super_align_spec.width_ - 1;
        }
      }
      local_2b8.super_align_spec.align_ = ALIGN_RIGHT;
      bStack_280 = 0;
      goto LAB_0011cfc1;
    }
  }
  local_288 = (local_248.super_basic_buffer<char>.size_ + 1) - (ulong)(bVar9 == 0);
  bStack_280 = bVar9;
LAB_0011cfc1:
  local_278 = &local_248;
  f._9_7_ = uStack_27f;
  f.sign = bStack_280;
  f.n = local_288;
  f.buffer = local_278;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,local_288,&local_2b8.super_align_spec,f);
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00194440;
  if (local_248.super_basic_buffer<char>.ptr_ == local_248.store_) {
    return;
  }
  operator_delete(local_248.super_basic_buffer<char>.ptr_,
                  local_248.super_basic_buffer<char>.capacity_);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  if (FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      std::numeric_limits<double>::is_iec559) {
    internal::fp fp_value(static_cast<double>(value));
    fp_value.normalize();
    // Find a cached power of 10 close to 1 / fp_value.
    int dec_exp = 0;
    const int min_exp = -60;
    auto dec_pow = internal::get_cached_power(
        min_exp - (fp_value.e + internal::fp::significand_size), dec_exp);
    internal::fp product = fp_value * dec_pow;
    // Generate output.
    internal::fp one(1ull << -product.e, product.e);
    uint64_t hi = product.f >> -one.e;
    uint64_t f = product.f & (one.f - 1);
    typedef back_insert_range<internal::basic_buffer<char_type>> range;
    basic_writer<range> w{range(buffer)};
    w.write(hi);
    size_t digits = buffer.size();
    w.write('.');
    const unsigned max_digits = 18;
    while (digits++ < max_digits) {
      f *= 10;
      w.write(static_cast<char>('0' + (f >> -one.e)));
      f &= one.f - 1;
    }
    w.write('e');
    w.write(-dec_exp);
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}